

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JPEGImageParser.cpp
# Opt level: O1

TwoLevelStatus __thiscall
JPEGImageParser::ReadStreamToBuffer
          (JPEGImageParser *this,unsigned_long inAmountToRead,unsigned_long *refReadLimit)

{
  int iVar1;
  undefined4 extraout_var;
  uint uVar2;
  ulong uVar3;
  
  if (*refReadLimit < inAmountToRead) {
    uVar2 = 0;
    uVar3 = 0xffffffff00000000;
  }
  else {
    iVar1 = (*(this->mImageStream->super_IByteReader)._vptr_IByteReader[2])
                      (this->mImageStream,this->mReadBuffer,inAmountToRead);
    uVar2 = -(uint)(CONCAT44(extraout_var,iVar1) != inAmountToRead);
    if (CONCAT44(extraout_var,iVar1) == inAmountToRead) {
      *refReadLimit = *refReadLimit - inAmountToRead;
    }
    uVar3 = 0;
  }
  return (TwoLevelStatus)(uVar2 | uVar3);
}

Assistant:

TwoLevelStatus JPEGImageParser::ReadStreamToBuffer(unsigned long inAmountToRead,unsigned long& refReadLimit)
{
	if (refReadLimit < inAmountToRead)
		return TwoLevelStatus(PDFHummus::eSuccess, PDFHummus::eFailure);
	EStatusCode status = ReadStreamToBuffer(inAmountToRead);
	if (status == PDFHummus::eSuccess)
		refReadLimit -= inAmountToRead;
	return TwoLevelStatus(status, PDFHummus::eSuccess);
}